

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O3

PAL_ERROR CorUnix::CPalSynchronizationManager::GetAbsoluteTimeout
                    (DWORD dwTimeout,timespec *ptsAbsTmo)

{
  int iVar1;
  PAL_ERROR PVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  iVar1 = clock_gettime(0,(timespec *)ptsAbsTmo);
  PVar2 = 0x54f;
  if (iVar1 == 0) {
    lVar6 = ptsAbsTmo->tv_sec + (ulong)dwTimeout / 1000;
    ptsAbsTmo->tv_sec = lVar6;
    uVar4 = (ulong)((dwTimeout % 1000) * 1000000) + ptsAbsTmo->tv_nsec;
    if (999999999 < (long)uVar4) {
      lVar3 = 0;
      if (0x773593fe < uVar4) {
        lVar3 = uVar4 - 1999999999;
      }
      uVar5 = (lVar3 + 999999999U) / 1000000000;
      uVar4 = (uVar4 - 1000000000) + uVar5 * -1000000000;
      ptsAbsTmo->tv_sec = uVar5 + lVar6 + 1;
    }
    ptsAbsTmo->tv_nsec = uVar4;
    PVar2 = 0;
  }
  return PVar2;
}

Assistant:

PAL_ERROR CPalSynchronizationManager::GetAbsoluteTimeout(DWORD dwTimeout,
                                                 struct timespec * ptsAbsTmo)
    {
        PAL_ERROR palErr = NO_ERROR;
        int iRet;

#if HAVE_WORKING_CLOCK_GETTIME
        // Not every platform implements a (working) clock_gettime
        iRet = clock_gettime(CLOCK_REALTIME, ptsAbsTmo);
#elif HAVE_WORKING_GETTIMEOFDAY
        // Not every platform implements a (working) gettimeofday
        struct timeval tv;
        iRet = gettimeofday(&tv, NULL);
        if (0 == iRet)
        {
            ptsAbsTmo->tv_sec  = tv.tv_sec;
            ptsAbsTmo->tv_nsec = tv.tv_usec * tccMicroSecondsToNanoSeconds;
        }
#else
        #error "Don't know how to get hi-res current time on this platform"
#endif // HAVE_WORKING_CLOCK_GETTIME, HAVE_WORKING_GETTIMEOFDAY

        if (0 == iRet)
        {
            ptsAbsTmo->tv_sec  += dwTimeout / tccSecondsToMillieSeconds;
            ptsAbsTmo->tv_nsec += (dwTimeout % tccSecondsToMillieSeconds) * tccMillieSecondsToNanoSeconds;
            while (ptsAbsTmo->tv_nsec >= tccSecondsToNanoSeconds)
            {
                ptsAbsTmo->tv_sec  += 1;
                ptsAbsTmo->tv_nsec -= tccSecondsToNanoSeconds;
            }
        }
        else
        {
            palErr = ERROR_INTERNAL_ERROR;
        }

        return palErr;
    }